

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
               (void)

{
  allocator<unsigned_int> *this;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  initializer_list<unsigned_int> __l_14;
  initializer_list<unsigned_int> __l_15;
  undefined8 uVar1;
  bool bVar2;
  pointer __args;
  pointer pPVar3;
  pointer pPVar4;
  reference pPVar5;
  int *__args_00;
  uint *__args_1;
  uint *__args_2;
  type_conflict1 *__args_1_00;
  type_conflict1 *__args_2_00;
  type_conflict *__args_01;
  lazy_ostream *plVar6;
  reference ptVar7;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var10;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar11;
  basic_cstring<const_char> local_1480;
  basic_cstring<const_char> local_1470;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1460;
  assertion_result local_1440;
  basic_cstring<const_char> local_1428;
  basic_cstring<const_char> local_1418;
  basic_cstring<const_char> local_1408;
  basic_cstring<const_char> local_13f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_13e8;
  assertion_result local_13c8;
  basic_cstring<const_char> local_13b0;
  basic_cstring<const_char> local_13a0;
  basic_cstring<const_char> local_1390;
  basic_cstring<const_char> local_1380;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1370;
  _Self local_1350;
  assertion_result local_1348;
  basic_cstring<const_char> local_1330;
  basic_cstring<const_char> local_1320;
  undefined4 local_130c;
  basic_cstring<const_char> local_1308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_12f8;
  basic_cstring<const_char> local_12d0;
  basic_cstring<const_char> local_12c0;
  undefined4 local_12ac;
  basic_cstring<const_char> local_12a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1298;
  basic_cstring<const_char> local_1270;
  basic_cstring<const_char> local_1260;
  undefined4 local_124c;
  basic_cstring<const_char> local_1248;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1238;
  basic_cstring<const_char> local_1210;
  basic_cstring<const_char> local_1200;
  undefined4 local_11ec;
  basic_cstring<const_char> local_11e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_11d8;
  basic_cstring<const_char> local_11b0;
  basic_cstring<const_char> local_11a0;
  undefined4 local_118c;
  basic_cstring<const_char> local_1188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1178;
  basic_cstring<const_char> local_1150;
  basic_cstring<const_char> local_1140;
  undefined4 local_112c;
  basic_cstring<const_char> local_1128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1118;
  basic_cstring<const_char> local_10f0;
  basic_cstring<const_char> local_10e0;
  undefined4 local_10cc;
  basic_cstring<const_char> local_10c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_10b8;
  basic_cstring<const_char> local_1090;
  basic_cstring<const_char> local_1080;
  undefined4 local_106c;
  basic_cstring<const_char> local_1068;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1058;
  basic_cstring<const_char> local_1030;
  basic_cstring<const_char> local_1020;
  undefined4 local_100c;
  basic_cstring<const_char> local_1008;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ff8;
  basic_cstring<const_char> local_fd0;
  basic_cstring<const_char> local_fc0;
  undefined4 local_fac;
  basic_cstring<const_char> local_fa8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f98;
  basic_cstring<const_char> local_f70;
  basic_cstring<const_char> local_f60;
  undefined4 local_f4c;
  basic_cstring<const_char> local_f48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f38;
  basic_cstring<const_char> local_f10;
  basic_cstring<const_char> local_f00;
  undefined4 local_eec;
  basic_cstring<const_char> local_ee8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ed8;
  basic_cstring<const_char> local_eb0;
  basic_cstring<const_char> local_ea0;
  undefined4 local_e8c;
  basic_cstring<const_char> local_e88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e78;
  basic_cstring<const_char> local_e50;
  basic_cstring<const_char> local_e40;
  undefined4 local_e2c;
  basic_cstring<const_char> local_e28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e18;
  basic_cstring<const_char> local_df0;
  basic_cstring<const_char> local_de0;
  undefined4 local_dcc;
  basic_cstring<const_char> local_dc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_db8;
  basic_cstring<const_char> local_d90;
  basic_cstring<const_char> local_d80;
  undefined4 local_d6c;
  basic_cstring<const_char> local_d68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d58;
  basic_cstring<const_char> local_d30;
  basic_cstring<const_char> local_d20;
  undefined4 local_d0c;
  basic_cstring<const_char> local_d08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_cf8;
  basic_cstring<const_char> local_cd0;
  basic_cstring<const_char> local_cc0;
  undefined4 local_cac;
  basic_cstring<const_char> local_ca8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c98;
  basic_cstring<const_char> local_c70;
  basic_cstring<const_char> local_c60;
  undefined4 local_c4c;
  basic_cstring<const_char> local_c48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c38;
  basic_cstring<const_char> local_c10;
  basic_cstring<const_char> local_c00;
  undefined4 local_bec;
  basic_cstring<const_char> local_be8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_bd8;
  basic_cstring<const_char> local_bb0;
  basic_cstring<const_char> local_ba0;
  undefined4 local_b8c;
  basic_cstring<const_char> local_b88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b78;
  basic_cstring<const_char> local_b50;
  basic_cstring<const_char> local_b40;
  undefined4 local_b2c;
  basic_cstring<const_char> local_b28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b18;
  basic_cstring<const_char> local_af0;
  basic_cstring<const_char> local_ae0;
  undefined4 local_acc;
  basic_cstring<const_char> local_ac8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ab8;
  basic_cstring<const_char> local_a90;
  basic_cstring<const_char> local_a80;
  undefined4 local_a6c;
  basic_cstring<const_char> local_a68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a58;
  basic_cstring<const_char> local_a30;
  basic_cstring<const_char> local_a20;
  undefined4 local_a0c;
  basic_cstring<const_char> local_a08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_9f8;
  basic_cstring<const_char> local_9d0;
  basic_cstring<const_char> local_9c0;
  undefined4 local_9ac;
  basic_cstring<const_char> local_9a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_998;
  basic_cstring<const_char> local_970;
  basic_cstring<const_char> local_960;
  undefined4 local_94c;
  basic_cstring<const_char> local_948;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_938;
  basic_cstring<const_char> local_910;
  basic_cstring<const_char> local_900;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_8f0;
  iterator it;
  type *z;
  type *y;
  type *x;
  uint local_8b8;
  _Base_ptr local_8b0;
  undefined1 local_8a8;
  _Base_ptr local_8a0;
  undefined1 local_898;
  _Self local_890;
  _Self local_888;
  const_iterator it_1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7d8;
  allocator<unsigned_int> local_7bd;
  uint local_7bc;
  iterator local_7b8;
  size_type local_7b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7a8;
  allocator<unsigned_int> local_789;
  uint local_788 [8];
  iterator local_768;
  size_type local_760;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_758;
  allocator<unsigned_int> local_73d;
  uint local_73c [3];
  iterator local_730;
  size_type local_728;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_720;
  allocator<unsigned_int> local_701;
  uint local_700 [4];
  iterator local_6f0;
  size_type local_6e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6e0;
  allocator<unsigned_int> local_6c5;
  uint local_6c4 [3];
  iterator local_6b8;
  size_type local_6b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6a8;
  allocator<unsigned_int> local_689;
  uint local_688 [4];
  iterator local_678;
  size_type local_670;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_668;
  allocator<unsigned_int> local_64d;
  uint local_64c [3];
  iterator local_640;
  size_type local_638;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_630;
  allocator<unsigned_int> local_611;
  uint local_610 [2];
  iterator local_608;
  size_type local_600;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5f8;
  allocator<unsigned_int> local_5dd;
  uint local_5dc;
  iterator local_5d8;
  size_type local_5d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5c8;
  allocator<unsigned_int> local_5a9;
  uint local_5a8 [2];
  iterator local_5a0;
  size_type local_598;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_590;
  allocator<unsigned_int> local_571;
  uint local_570 [2];
  iterator local_568;
  size_type local_560;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_558;
  allocator<unsigned_int> local_539;
  uint local_538 [2];
  iterator local_530;
  size_type local_528;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_520;
  allocator<unsigned_int> local_501;
  uint local_500 [2];
  iterator local_4f8;
  size_type local_4f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4e8;
  allocator<unsigned_int> local_4c9;
  uint local_4c8 [2];
  iterator local_4c0;
  size_type local_4b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4b0;
  allocator<unsigned_int> local_491;
  uint local_490 [2];
  iterator local_488;
  size_type local_480;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_478;
  allocator<unsigned_int> local_45d;
  uint local_45c;
  iterator local_458;
  size_type local_450;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_448;
  undefined1 local_430 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  reducedMatrix;
  Barcode *barcode;
  undefined4 local_408;
  undefined4 local_404;
  initializer_list<unsigned_int> local_400;
  Insertion_return local_3f0;
  uint local_3d4 [3];
  initializer_list<unsigned_int> local_3c8;
  Insertion_return local_3b8;
  uint local_3a0 [2];
  initializer_list<unsigned_int> local_398;
  Insertion_return local_388;
  uint local_370 [2];
  initializer_list<unsigned_int> local_368;
  Insertion_return local_358;
  uint local_340 [2];
  initializer_list<unsigned_int> local_338;
  Insertion_return local_328;
  uint local_310 [2];
  initializer_list<unsigned_int> local_308;
  Insertion_return local_2f8;
  uint local_2e0 [2];
  initializer_list<unsigned_int> local_2d8;
  Insertion_return local_2c8;
  uint local_2b0 [2];
  initializer_list<unsigned_int> local_2a8;
  Insertion_return local_298;
  uint local_280 [2];
  initializer_list<unsigned_int> local_278;
  Insertion_return local_268;
  uint local_250 [2];
  initializer_list<unsigned_int> local_248;
  Insertion_return local_238;
  initializer_list<unsigned_int> local_220;
  Insertion_return local_210;
  initializer_list<unsigned_int> local_1f8;
  Insertion_return local_1e8;
  initializer_list<unsigned_int> local_1d0;
  Insertion_return local_1c0;
  initializer_list<unsigned_int> local_1a8;
  Insertion_return local_198;
  initializer_list<unsigned_int> local_180;
  Insertion_return local_170;
  initializer_list<unsigned_int> local_158;
  Insertion_return local_148;
  initializer_list<unsigned_int> local_120;
  Insertion_return local_110;
  undefined1 local_f8 [8];
  Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>
  m;
  
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>
  ::Matrix((Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>
            *)local_f8,0x11,2);
  std::initializer_list<unsigned_int>::initializer_list(&local_120);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_110,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0,&local_120,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_110);
  std::initializer_list<unsigned_int>::initializer_list(&local_158);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_148,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,1,&local_158,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_148);
  std::initializer_list<unsigned_int>::initializer_list(&local_180);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_170,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,2,&local_180,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_170);
  std::initializer_list<unsigned_int>::initializer_list(&local_1a8);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_198,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,3,&local_1a8,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_198);
  std::initializer_list<unsigned_int>::initializer_list(&local_1d0);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_1c0,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,4,&local_1d0,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1c0);
  std::initializer_list<unsigned_int>::initializer_list(&local_1f8);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_1e8,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,5,&local_1f8,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1e8);
  std::initializer_list<unsigned_int>::initializer_list(&local_220);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_210,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,6,&local_220,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_210);
  local_250[0] = 0;
  local_250[1] = 1;
  local_248._M_array = local_250;
  local_248._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_238,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,10,&local_248,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_238);
  local_280[0] = 1;
  local_280[1] = 3;
  local_278._M_array = local_280;
  local_278._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_268,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0xb,&local_278,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_268);
  local_2b0[0] = 2;
  local_2b0[1] = 3;
  local_2a8._M_array = local_2b0;
  local_2a8._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_298,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0xc,&local_2a8,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_298);
  local_2e0[0] = 2;
  local_2e0[1] = 4;
  local_2d8._M_array = local_2e0;
  local_2d8._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_2c8,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0xd,&local_2d8,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2c8);
  local_310[0] = 3;
  local_310[1] = 4;
  local_308._M_array = local_310;
  local_308._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_2f8,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0xe,&local_308,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2f8);
  local_340[0] = 2;
  local_340[1] = 6;
  local_338._M_array = local_340;
  local_338._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_328,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0xf,&local_338,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_328);
  local_370[0] = 4;
  local_370[1] = 6;
  local_368._M_array = local_370;
  local_368._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_358,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0x10,&local_368,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_358);
  local_3a0[0] = 5;
  local_3a0[1] = 6;
  local_398._M_array = local_3a0;
  local_398._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_388,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0x11,&local_398,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_388);
  local_3d4[0] = 0xc;
  local_3d4[1] = 0xd;
  local_3d4[2] = 0xe;
  local_3c8._M_array = local_3d4;
  local_3c8._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_3b8,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0x1e,&local_3c8,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3b8);
  barcode._4_4_ = 0xd;
  local_408 = 0xf;
  local_404 = 0x10;
  local_400._M_array = (iterator)((long)&barcode + 4);
  local_400._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>::
  insert_boundary<std::initializer_list<unsigned_int>>
            (&local_3f0,
             (Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
              *)local_f8,0x1f,&local_400,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3f0);
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Gudhi::persistence_matrix::
                Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
                ::get_current_barcode_abi_cxx11_
                          ((Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>
                            *)local_f8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_430);
  local_45c = 0;
  local_458 = &local_45c;
  local_450 = 1;
  std::allocator<unsigned_int>::allocator(&local_45d);
  __l_15._M_len = local_450;
  __l_15._M_array = local_458;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_448,__l_15,&local_45d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_448);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_448);
  std::allocator<unsigned_int>::~allocator(&local_45d);
  local_490[0] = 0;
  local_490[1] = 1;
  local_488 = local_490;
  local_480 = 2;
  std::allocator<unsigned_int>::allocator(&local_491);
  __l_14._M_len = local_480;
  __l_14._M_array = local_488;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_478,__l_14,&local_491);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_478);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_478);
  std::allocator<unsigned_int>::~allocator(&local_491);
  local_4c8[0] = 0;
  local_4c8[1] = 2;
  local_4c0 = local_4c8;
  local_4b8 = 2;
  std::allocator<unsigned_int>::allocator(&local_4c9);
  __l_13._M_len = local_4b8;
  __l_13._M_array = local_4c0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4b0,__l_13,&local_4c9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_4b0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4b0);
  std::allocator<unsigned_int>::~allocator(&local_4c9);
  local_500[0] = 0;
  local_500[1] = 3;
  local_4f8 = local_500;
  local_4f0 = 2;
  std::allocator<unsigned_int>::allocator(&local_501);
  __l_12._M_len = local_4f0;
  __l_12._M_array = local_4f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4e8,__l_12,&local_501);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_4e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4e8);
  std::allocator<unsigned_int>::~allocator(&local_501);
  local_538[0] = 0;
  local_538[1] = 4;
  local_530 = local_538;
  local_528 = 2;
  std::allocator<unsigned_int>::allocator(&local_539);
  __l_11._M_len = local_528;
  __l_11._M_array = local_530;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_520,__l_11,&local_539);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_520);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_520);
  std::allocator<unsigned_int>::~allocator(&local_539);
  local_570[0] = 0;
  local_570[1] = 5;
  local_568 = local_570;
  local_560 = 2;
  std::allocator<unsigned_int>::allocator(&local_571);
  __l_10._M_len = local_560;
  __l_10._M_array = local_568;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_558,__l_10,&local_571);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_558);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_558);
  std::allocator<unsigned_int>::~allocator(&local_571);
  local_5a8[0] = 0;
  local_5a8[1] = 6;
  local_5a0 = local_5a8;
  local_598 = 2;
  std::allocator<unsigned_int>::allocator(&local_5a9);
  __l_09._M_len = local_598;
  __l_09._M_array = local_5a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_590,__l_09,&local_5a9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_590);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_590);
  std::allocator<unsigned_int>::~allocator(&local_5a9);
  local_5dc = 10;
  local_5d8 = &local_5dc;
  local_5d0 = 1;
  std::allocator<unsigned_int>::allocator(&local_5dd);
  __l_08._M_len = local_5d0;
  __l_08._M_array = local_5d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5c8,__l_08,&local_5dd);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_5c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5c8);
  std::allocator<unsigned_int>::~allocator(&local_5dd);
  local_610[0] = 10;
  local_610[1] = 0xb;
  local_608 = local_610;
  local_600 = 2;
  std::allocator<unsigned_int>::allocator(&local_611);
  __l_07._M_len = local_600;
  __l_07._M_array = local_608;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5f8,__l_07,&local_611);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_5f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5f8);
  std::allocator<unsigned_int>::~allocator(&local_611);
  local_64c[0] = 10;
  local_64c[1] = 0xb;
  local_64c[2] = 0xc;
  local_640 = local_64c;
  local_638 = 3;
  std::allocator<unsigned_int>::allocator(&local_64d);
  __l_06._M_len = local_638;
  __l_06._M_array = local_640;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_630,__l_06,&local_64d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_630);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_630);
  std::allocator<unsigned_int>::~allocator(&local_64d);
  local_688[0] = 10;
  local_688[1] = 0xb;
  local_688[2] = 0xc;
  local_688[3] = 0xd;
  local_678 = local_688;
  local_670 = 4;
  std::allocator<unsigned_int>::allocator(&local_689);
  __l_05._M_len = local_670;
  __l_05._M_array = local_678;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_668,__l_05,&local_689);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_668);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_668);
  std::allocator<unsigned_int>::~allocator(&local_689);
  local_6c4[0] = 0xc;
  local_6c4[1] = 0xd;
  local_6c4[2] = 0xe;
  local_6b8 = local_6c4;
  local_6b0 = 3;
  std::allocator<unsigned_int>::allocator(&local_6c5);
  __l_04._M_len = local_6b0;
  __l_04._M_array = local_6b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_6a8,__l_04,&local_6c5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_6a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6a8);
  std::allocator<unsigned_int>::~allocator(&local_6c5);
  local_700[0] = 10;
  local_700[1] = 0xb;
  local_700[2] = 0xc;
  local_700[3] = 0xf;
  local_6f0 = local_700;
  local_6e8 = 4;
  std::allocator<unsigned_int>::allocator(&local_701);
  __l_03._M_len = local_6e8;
  __l_03._M_array = local_6f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_6e0,__l_03,&local_701);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_6e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6e0);
  std::allocator<unsigned_int>::~allocator(&local_701);
  local_73c[0] = 0xd;
  local_73c[1] = 0xf;
  local_73c[2] = 0x10;
  local_730 = local_73c;
  local_728 = 3;
  std::allocator<unsigned_int>::allocator(&local_73d);
  __l_02._M_len = local_728;
  __l_02._M_array = local_730;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_720,__l_02,&local_73d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_720);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_720);
  std::allocator<unsigned_int>::~allocator(&local_73d);
  local_788[0] = 10;
  local_788[1] = 0xb;
  local_788[2] = 0xc;
  local_788[3] = 0xf;
  local_788[4] = 0x11;
  local_768 = local_788;
  local_760 = 5;
  std::allocator<unsigned_int>::allocator(&local_789);
  __l_01._M_len = local_760;
  __l_01._M_array = local_768;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_758,__l_01,&local_789);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_758);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_758);
  std::allocator<unsigned_int>::~allocator(&local_789);
  local_7bc = 0x1e;
  local_7b8 = &local_7bc;
  local_7b0 = 1;
  std::allocator<unsigned_int>::allocator(&local_7bd);
  __l_00._M_len = local_7b0;
  __l_00._M_array = local_7b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_7a8,__l_00,&local_7bd);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_7a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7a8);
  std::allocator<unsigned_int>::~allocator(&local_7bd);
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x1f;
  this = (allocator<unsigned_int> *)
         ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 3);
  std::allocator<unsigned_int>::allocator(this);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_7d8,__l,this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_430,&local_7d8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7d8);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 3));
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_430,
             (Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>
              *)local_f8);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  local_888._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ::begin((list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_890._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end((list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=(&local_888,&local_890);
    if (!bVar2) break;
    __args = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_888);
    pPVar3 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_888);
    pPVar4 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_888);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,&__args->dim,
                        &pPVar3->birth,&pPVar4->death);
    local_8a0 = (_Base_ptr)pVar11.first._M_node;
    local_898 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_888);
    __args_00 = std::get<2ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_888);
    __args_1 = std::get<0ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_888);
    __args_2 = std::get<1ul,int,unsigned_int>(pPVar5);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count,__args_00,
                        __args_1,__args_2);
    local_8b0 = (_Base_ptr)pVar11.first._M_node;
    local_8a8 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_888);
    local_8b8 = pPVar5->death;
    x = *(type **)pPVar5;
    __args_1_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<0ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_2_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<1ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_01 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<2ul>
                          ((Persistence_interval<int,unsigned_int> *)&x);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int&,unsigned_int&,unsigned_int&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&it_1,__args_01,__args_1_00,__args_2_00);
    it._M_node = (_Base_ptr)pVar11.first._M_node;
    std::_List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>::
    operator++(&local_888);
  }
  local_8f0._M_node =
       (_Base_ptr)
       std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
       begin((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_900,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_910);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_900,0x634,&local_910);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_938,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_948,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_94c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_938,&local_948,0x634,1,2,p_Var8,"std::get<0>(*it)",&local_94c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_938);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_960,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_970);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_960,0x635,&local_970);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_998,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_9ac = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_998,&local_9a8,0x635,1,2,p_Var9,"std::get<1>(*it)",&local_9ac,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_998);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9c0,0x636,&local_9d0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_9f8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_a0c = 0xffffffff;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_9f8,&local_a08,0x636,1,2,p_Var10,"std::get<2>(*it)",&local_a0c,"-1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a20,0x638,&local_a30);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a58,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_a6c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a58,&local_a68,0x638,1,2,p_Var8,"std::get<0>(*it)",&local_a6c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a80,0x639,&local_a90);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ab8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ac8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_acc = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ab8,&local_ac8,0x639,1,2,p_Var9,"std::get<1>(*it)",&local_acc,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ab8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ae0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_af0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ae0,0x63a,&local_af0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b18,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_b2c = 7;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b18,&local_b28,0x63a,1,2,p_Var10,"std::get<2>(*it)",&local_b2c,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b40,0x63c,&local_b50);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b78,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_b8c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b78,&local_b88,0x63c,1,2,p_Var8,"std::get<0>(*it)",&local_b8c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ba0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ba0,0x63d,&local_bb0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_bd8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_be8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_bec = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_bd8,&local_be8,0x63d,1,2,p_Var9,"std::get<1>(*it)",&local_bec,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_bd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c00,0x63e,&local_c10);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c38,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_c4c = 9;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c38,&local_c48,0x63e,1,2,p_Var10,"std::get<2>(*it)",&local_c4c,"9");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c60,0x640,&local_c70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c98,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ca8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_cac = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c98,&local_ca8,0x640,1,2,p_Var8,"std::get<0>(*it)",&local_cac,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_cc0,0x641,&local_cd0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_cf8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_d0c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_cf8,&local_d08,0x641,1,2,p_Var9,"std::get<1>(*it)",&local_d0c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_cf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d20,0x642,&local_d30);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d58,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_d6c = 8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_d58,&local_d68,0x642,1,2,p_Var10,"std::get<2>(*it)",&local_d6c,"8");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d80,0x644,&local_d90);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_db8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_dc8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_dcc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_db8,&local_dc8,0x644,1,2,p_Var8,"std::get<0>(*it)",&local_dcc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_db8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_de0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_df0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_de0,0x645,&local_df0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e18,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_e2c = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e18,&local_e28,0x645,1,2,p_Var9,"std::get<1>(*it)",&local_e2c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e40,0x646,&local_e50);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e78,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_e8c = 10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e78,&local_e88,0x646,1,2,p_Var10,"std::get<2>(*it)",&local_e8c,"10");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ea0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_eb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ea0,0x648,&local_eb0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ed8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ee8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_eec = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ed8,&local_ee8,0x648,1,2,p_Var8,"std::get<0>(*it)",&local_eec,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ed8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f00,0x649,&local_f10);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f38,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_f4c = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_f38,&local_f48,0x649,1,2,p_Var9,"std::get<1>(*it)",&local_f4c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f60,0x64a,&local_f70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f98,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fa8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_fac = 0xe;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_f98,&local_fa8,0x64a,1,2,p_Var10,"std::get<2>(*it)",&local_fac,"14");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_fd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_fc0,0x64c,&local_fd0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ff8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1008,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_100c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ff8,&local_1008,0x64c,1,2,p_Var8,"std::get<0>(*it)",&local_100c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ff8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1020,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1030);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1020,0x64d,&local_1030);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1058,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1068,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_106c = 6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1058,&local_1068,0x64d,1,2,p_Var9,"std::get<1>(*it)",&local_106c,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1058);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1080,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1090);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1080,0x64e,&local_1090);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_10b8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_10cc = 0xc;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_10b8,&local_10c8,0x64e,1,2,p_Var10,"std::get<2>(*it)",&local_10cc,"12");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_10b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10e0,0x650,&local_10f0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1118,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1128,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_112c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1118,&local_1128,0x650,1,2,p_Var8,"std::get<0>(*it)",&local_112c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1118);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1140,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1150);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1140,0x651,&local_1150);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1178,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1188,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_118c = 0xb;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1178,&local_1188,0x651,1,2,p_Var9,"std::get<1>(*it)",&local_118c,"11");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1178);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_11a0,0x652,&local_11b0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_11d8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_11ec = 0xf;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_11d8,&local_11e8,0x652,1,2,p_Var10,"std::get<2>(*it)",&local_11ec,"15");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_11d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1200,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1210);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1200,0x654,&local_1210);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1238,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1248,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_124c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1238,&local_1248,0x654,1,2,p_Var8,"std::get<0>(*it)",&local_124c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1238);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1260,0x655,&local_1270);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1298,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_12ac = 0xd;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1298,&local_12a8,0x655,1,2,p_Var9,"std::get<1>(*it)",&local_12ac,"13");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1298);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_12d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_12c0,0x656,&local_12d0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_12f8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1308,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_8f0);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_130c = 0x10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_12f8,&local_1308,0x656,1,2,p_Var10,"std::get<2>(*it)",&local_130c,"16");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_12f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_8f0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1320,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1330);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1320,0x658,&local_1330);
    local_1350._M_node =
         (_Base_ptr)
         std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
         end((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::operator==(&local_8f0,&local_1350);
    boost::test_tools::assertion_result::assertion_result(&local_1348,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1380,"it == bars1.end()",0x11);
    boost::unit_test::operator<<(&local_1370,plVar6,&local_1380);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1390,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1348,&local_1370,&local_1390,0x658,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1370);
    boost::test_tools::assertion_result::~assertion_result(&local_1348);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_13b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_13a0,0x65a,&local_13b0);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::test_tools::assertion_result::assertion_result(&local_13c8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13f8,"bars1 == bars2",0xe);
    boost::unit_test::operator<<(&local_13e8,plVar6,&local_13f8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1408,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_13c8,&local_13e8,&local_1408,0x65a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_13e8);
    boost::test_tools::assertion_result::~assertion_result(&local_13c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1428);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1418,0x65b,&local_1428);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&it_1);
    boost::test_tools::assertion_result::assertion_result(&local_1440,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1470,"bars1 == bars3",0xe);
    boost::unit_test::operator<<(&local_1460,plVar6,&local_1470);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1480,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1440,&local_1460,&local_1480,0x65b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1460);
    boost::test_tools::assertion_result::~assertion_result(&local_1440);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_430);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>
  ::~Matrix((Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true>_>
             *)local_f8);
  return;
}

Assistant:

void test_shifted_barcode1() {
  using C = typename Matrix::Column;
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  Matrix m(17, 2);
  if constexpr (is_z2<C>()) {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {0, 1}, 1);
    m.insert_boundary(11, {1, 3}, 1);
    m.insert_boundary(12, {2, 3}, 1);
    m.insert_boundary(13, {2, 4}, 1);
    m.insert_boundary(14, {3, 4}, 1);
    m.insert_boundary(15, {2, 6}, 1);
    m.insert_boundary(16, {4, 6}, 1);
    m.insert_boundary(17, {5, 6}, 1);
    m.insert_boundary(30, {12, 13, 14}, 2);
    m.insert_boundary(31, {13, 15, 16}, 2);
  } else {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {{0, 1}, {1, 1}}, 1);
    m.insert_boundary(11, {{1, 1}, {3, 1}}, 1);
    m.insert_boundary(12, {{2, 1}, {3, 1}}, 1);
    m.insert_boundary(13, {{2, 1}, {4, 1}}, 1);
    m.insert_boundary(14, {{3, 1}, {4, 1}}, 1);
    m.insert_boundary(15, {{2, 1}, {6, 1}}, 1);
    m.insert_boundary(16, {{4, 1}, {6, 1}}, 1);
    m.insert_boundary(17, {{5, 1}, {6, 1}}, 1);
    m.insert_boundary(30, {{12, 1}, {13, 1}, {14, 1}}, 2);
    m.insert_boundary(31, {{13, 1}, {15, 1}, {16, 1}}, 2);
  }

  const auto& barcode = m.get_current_barcode();

  std::vector<witness_content<C> > reducedMatrix;
  if constexpr (is_z2<C>()) {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({1, 3});
      reducedMatrix.push_back({1, 2});
      reducedMatrix.push_back({2, 4});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 6});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 5});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({13, 15, 16});
    } else {
      reducedMatrix.push_back({0});
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({0, 2});
      reducedMatrix.push_back({0, 3});
      reducedMatrix.push_back({0, 4});
      reducedMatrix.push_back({0, 5});
      reducedMatrix.push_back({0, 6});
      reducedMatrix.push_back({10});
      reducedMatrix.push_back({10, 11});
      reducedMatrix.push_back({10, 11, 12});
      reducedMatrix.push_back({10, 11, 12, 13});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({10, 11, 12, 15});
      reducedMatrix.push_back({13, 15, 16});
      reducedMatrix.push_back({10, 11, 12, 15, 17});
      reducedMatrix.push_back({30});
      reducedMatrix.push_back({31});
    }
  } else {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{1, 1}, {3, 1}});
      reducedMatrix.push_back({{1, 1}, {2, 1}});
      reducedMatrix.push_back({{2, 1}, {4, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {6, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {5, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
    } else {
      reducedMatrix.push_back({{0, 1}});
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{0, 1}, {2, 1}});
      reducedMatrix.push_back({{0, 1}, {3, 1}});
      reducedMatrix.push_back({{0, 1}, {4, 1}});
      reducedMatrix.push_back({{0, 1}, {5, 1}});
      reducedMatrix.push_back({{0, 1}, {6, 1}});
      reducedMatrix.push_back({{10, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {13, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}, {17, 1}});
      reducedMatrix.push_back({{30, 1}});
      reducedMatrix.push_back({{31, 1}});
    }
  }

  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    test_column_equality<C>(reducedMatrix[0], get_column_content_via_iterators(m.get_column(0)));
    test_column_equality<C>(reducedMatrix[1], get_column_content_via_iterators(m.get_column(1)));
    test_column_equality<C>(reducedMatrix[2], get_column_content_via_iterators(m.get_column(2)));
    test_column_equality<C>(reducedMatrix[3], get_column_content_via_iterators(m.get_column(3)));
    test_column_equality<C>(reducedMatrix[4], get_column_content_via_iterators(m.get_column(4)));
    test_column_equality<C>(reducedMatrix[5], get_column_content_via_iterators(m.get_column(5)));
    test_column_equality<C>(reducedMatrix[6], get_column_content_via_iterators(m.get_column(6)));
    test_column_equality<C>(reducedMatrix[7], get_column_content_via_iterators(m.get_column(10)));
    test_column_equality<C>(reducedMatrix[8], get_column_content_via_iterators(m.get_column(11)));
    test_column_equality<C>(reducedMatrix[9], get_column_content_via_iterators(m.get_column(12)));
    test_column_equality<C>(reducedMatrix[10], get_column_content_via_iterators(m.get_column(13)));
    test_column_equality<C>(reducedMatrix[11], get_column_content_via_iterators(m.get_column(14)));
    test_column_equality<C>(reducedMatrix[12], get_column_content_via_iterators(m.get_column(15)));
    test_column_equality<C>(reducedMatrix[13], get_column_content_via_iterators(m.get_column(16)));
    test_column_equality<C>(reducedMatrix[14], get_column_content_via_iterators(m.get_column(17)));
    test_column_equality<C>(reducedMatrix[15], get_column_content_via_iterators(m.get_column(30)));
    test_column_equality<C>(reducedMatrix[16], get_column_content_via_iterators(m.get_column(31)));
  } else {
    test_content_equality(reducedMatrix, m);
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 7);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 9);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 3);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 4);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 10);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 14);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 6);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 12);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 11);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 15);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 13);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 16);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}